

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O0

int Saig_MvCreateObj(Saig_MvMan_t *p,int iFan0,int iFan1)

{
  int iVar1;
  int b;
  Saig_MvAnd_t *pSVar2;
  uchar *local_30;
  Saig_MvAnd_t *local_28;
  Saig_MvAnd_t *pNode;
  int iFan1_local;
  int iFan0_local;
  Saig_MvMan_t *p_local;
  
  if (p->nObjs == p->nObjsAlloc) {
    if (p->pAigNew == (Saig_MvAnd_t *)0x0) {
      local_28 = (Saig_MvAnd_t *)malloc((long)(p->nObjsAlloc << 1) * 0xc);
    }
    else {
      local_28 = (Saig_MvAnd_t *)realloc(p->pAigNew,(long)(p->nObjsAlloc << 1) * 0xc);
    }
    p->pAigNew = local_28;
    if (p->pLevels == (uchar *)0x0) {
      local_30 = (uchar *)malloc((long)(p->nObjsAlloc << 1));
    }
    else {
      local_30 = (uchar *)realloc(p->pLevels,(long)(p->nObjsAlloc << 1));
    }
    p->pLevels = local_30;
    p->nObjsAlloc = p->nObjsAlloc << 1;
  }
  pSVar2 = p->pAigNew + p->nObjs;
  pSVar2->iFan0 = iFan0;
  pSVar2->iFan1 = iFan1;
  pSVar2->iNext = 0;
  if ((iFan0 == 0) && (iFan1 == 0)) {
    p->pLevels[p->nObjs] = '\0';
    p->nPis = p->nPis + 1;
  }
  else {
    iVar1 = Saig_MvLev(p,iFan0);
    b = Saig_MvLev(p,iFan1);
    iVar1 = Abc_MaxInt(iVar1,b);
    p->pLevels[p->nObjs] = (char)iVar1 + '\x01';
  }
  iVar1 = p->nObjs;
  p->nObjs = iVar1 + 1;
  return iVar1;
}

Assistant:

static inline int Saig_MvCreateObj( Saig_MvMan_t * p, int iFan0, int iFan1 )
{
    Saig_MvAnd_t * pNode;
    if ( p->nObjs == p->nObjsAlloc )
    {
        p->pAigNew = ABC_REALLOC( Saig_MvAnd_t, p->pAigNew, 2*p->nObjsAlloc );
        p->pLevels = ABC_REALLOC( unsigned char, p->pLevels, 2*p->nObjsAlloc );
        p->nObjsAlloc *= 2;
    }
    pNode = p->pAigNew + p->nObjs;
    pNode->iFan0 = iFan0;
    pNode->iFan1 = iFan1;
    pNode->iNext = 0;
    if ( iFan0 || iFan1 )
        p->pLevels[p->nObjs] = 1 + Abc_MaxInt( Saig_MvLev(p, iFan0), Saig_MvLev(p, iFan1) );
    else
        p->pLevels[p->nObjs] = 0, p->nPis++;
    return p->nObjs++;
}